

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalStringConcatenate
          (Evaluator *this,Token *op,GCPtr<symbols::Object> *left,GCPtr<symbols::Object> *right)

{
  __type _Var1;
  bool bVar2;
  Object *pOVar3;
  StringObject *this_00;
  long local_130;
  long local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  string local_c8;
  __unspec local_a4;
  type local_a3;
  __unspec local_a2;
  type local_a1;
  undefined4 local_a0;
  undefined1 local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  string rightValue;
  string leftValue;
  GCPtr<symbols::Object> *right_local;
  GCPtr<symbols::Object> *left_local;
  Token *op_local;
  
  pOVar3 = GCPtr<symbols::Object>::raw(left);
  if (pOVar3 == (Object *)0x0) {
    local_120 = 0;
  }
  else {
    local_120 = __dynamic_cast(pOVar3,&symbols::Object::typeinfo,&symbols::StringObject::typeinfo,0)
    ;
  }
  std::__cxx11::string::string
            ((string *)(rightValue.field_2._M_local_buf + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_120 + 0x10)
            );
  pOVar3 = GCPtr<symbols::Object>::raw(right);
  if (pOVar3 == (Object *)0x0) {
    local_130 = 0;
  }
  else {
    local_130 = __dynamic_cast(pOVar3,&symbols::Object::typeinfo,&symbols::StringObject::typeinfo,0)
    ;
  }
  std::__cxx11::string::string
            ((string *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_130 + 0x10)
            );
  switch(op->Type) {
  case EQ:
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&rightValue.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    nativeBooleanObject(this,_Var1);
    break;
  case NOT_EQ:
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&rightValue.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    nativeBooleanObject(this,!_Var1);
    break;
  case GT:
    local_a3 = (type)std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&rightValue.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68);
    std::__cmp_cat::__unspec::__unspec(&local_a4,(__unspec *)0x0);
    bVar2 = std::operator>(local_a3);
    nativeBooleanObject(this,bVar2);
    break;
  case LT:
    local_a1 = (type)std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&rightValue.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68);
    std::__cmp_cat::__unspec::__unspec(&local_a2,(__unspec *)0x0);
    bVar2 = std::operator<(local_a1);
    nativeBooleanObject(this,bVar2);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Unknown Operator: ",&local_c9);
    std::operator+(&local_f0,&op->Literal," invalid operation on type string");
    newError(this,&local_c8,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    break;
  case PLUS:
    this_00 = (StringObject *)operator_new(0x38);
    local_99 = 1;
    std::operator+(&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rightValue.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    symbols::StringObject::StringObject(this_00,&local_98);
    local_99 = 0;
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_00);
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_a0 = 1;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(rightValue.field_2._M_local_buf + 8));
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalStringConcatenate(Token& op, GCPtr<Object> left, GCPtr<Object> right){
    auto leftValue = dynamic_cast<StringObject*>(left.raw())->value;
    auto rightValue = dynamic_cast<StringObject*>(right.raw())->value;
    switch (op.Type) {
    case TokenType::PLUS:
    {
        return new StringObject(leftValue + rightValue);
    }
    case TokenType::EQ:
        return nativeBooleanObject(leftValue  == rightValue);
    case TokenType::NOT_EQ:
        return nativeBooleanObject(leftValue  != rightValue);
    case TokenType::LT:
        return nativeBooleanObject(leftValue  < rightValue);
    case TokenType::GT:
        return nativeBooleanObject(leftValue  > rightValue);
    default:
        return newError("Unknown Operator: ", op.Literal + " invalid operation on type string");
    }
}